

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O1

void Prs_ManInitializeNtk(Prs_Man_t *p,int iName,int fSlices)

{
  int *piVar1;
  uint uVar2;
  Hash_IntMan_t *pHVar3;
  Vec_Ptr_t *pVVar4;
  Prs_Ntk_t *pPVar5;
  Abc_Nam_t *pAVar6;
  void **ppvVar7;
  int iVar8;
  
  if (p->pNtk != (Prs_Ntk_t *)0x0) {
    __assert_fail("p->pNtk == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                  ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
  }
  pPVar5 = (Prs_Ntk_t *)calloc(1,0xf0);
  p->pNtk = pPVar5;
  pPVar5->iModuleName = iName;
  pPVar5->field_0x4 = pPVar5->field_0x4 | 2;
  pAVar6 = Abc_NamRef(p->pStrs);
  p->pNtk->pStrs = pAVar6;
  pAVar6 = Abc_NamRef(p->pFuns);
  pPVar5 = p->pNtk;
  pPVar5->pFuns = pAVar6;
  pHVar3 = p->vHash;
  piVar1 = &pHVar3->nRefs;
  *piVar1 = *piVar1 + 1;
  pPVar5->vHash = pHVar3;
  pVVar4 = p->vNtks;
  uVar2 = pVVar4->nCap;
  if (pVVar4->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar7;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar2 * 2;
      if (iVar8 <= (int)uVar2) goto LAB_003e8109;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar7;
    }
    pVVar4->nCap = iVar8;
  }
LAB_003e8109:
  iVar8 = pVVar4->nSize;
  pVVar4->nSize = iVar8 + 1;
  pVVar4->pArray[iVar8] = pPVar5;
  return;
}

Assistant:

static inline void Prs_ManInitializeNtk( Prs_Man_t * p, int iName, int fSlices )
{
    assert( p->pNtk == NULL );
    p->pNtk = ABC_CALLOC( Prs_Ntk_t, 1 );
    p->pNtk->iModuleName = iName;
    p->pNtk->fSlices = fSlices;
    p->pNtk->pStrs = Abc_NamRef( p->pStrs );
    p->pNtk->pFuns = Abc_NamRef( p->pFuns );
    p->pNtk->vHash = Hash_IntManRef( p->vHash );
    Vec_PtrPush( p->vNtks, p->pNtk );
}